

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int find_private_class_field(JSContext *ctx,JSFunctionDef *fd,JSAtom name,int scope_level)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  
  piVar4 = (int *)(ctx->native_error_proto[5].tag + (long)(int)name * 8 + 4);
  while( true ) {
    iVar1 = *piVar4;
    if ((long)iVar1 == -1) {
      return -1;
    }
    lVar2 = (ctx->promise_ctor).tag;
    lVar5 = (long)iVar1 * 0x10;
    if (*(JSAtom *)(lVar2 + 4 + lVar5) != name) break;
    piVar3 = (int *)(lVar2 + lVar5);
    piVar4 = piVar3 + 2;
    if (*piVar3 == (int)fd) {
      return iVar1;
    }
  }
  return -1;
}

Assistant:

static int find_private_class_field(JSContext *ctx, JSFunctionDef *fd,
                                    JSAtom name, int scope_level)
{
    int idx;
    idx = fd->scopes[scope_level].first;
    while (idx != -1) {
        if (fd->vars[idx].scope_level != scope_level)
            break;
        if (fd->vars[idx].var_name == name)
            return idx;
        idx = fd->vars[idx].scope_next;
    }
    return -1;
}